

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::SetDefaultFunctionEntryPointInfo
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,
          JavascriptMethod originalEntryPoint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (entryPointInfo == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x402,"(entryPointInfo)","entryPointInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
            (&(this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo,
             (ProxyEntryPointInfo *)entryPointInfo);
  Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::WriteBarrierSet
            (&this->defaultFunctionEntryPointInfo,entryPointInfo);
  FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,originalEntryPoint);
  return;
}

Assistant:

void FunctionBody::SetDefaultFunctionEntryPointInfo(FunctionEntryPointInfo* entryPointInfo, const JavascriptMethod originalEntryPoint)
    {
        Assert(entryPointInfo);

        // Need to set twice since ProxyEntryPointInfo cast points to an interior pointer
        this->m_defaultEntryPointInfo = (ProxyEntryPointInfo*) entryPointInfo;
        this->defaultFunctionEntryPointInfo = entryPointInfo;
        SetOriginalEntryPoint(originalEntryPoint);
    }